

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ts-data-model.obx.cpp
# Opt level: O0

void objectbox::tsdemo::SensorValues::_OBX_MetaInfo::fromFlatBuffer
               (void *data,size_t param_2,SensorValues *outObject)

{
  Table *this;
  unsigned_long uVar1;
  long lVar2;
  double dVar3;
  Table *table;
  SensorValues *outObject_local;
  size_t param_1_local;
  void *data_local;
  
  this = flatbuffers::GetRoot<flatbuffers::Table>(data);
  if (this != (Table *)0x0) {
    uVar1 = flatbuffers::Table::GetField<unsigned_long>(this,4,0);
    outObject->id = uVar1;
    lVar2 = flatbuffers::Table::GetField<long>(this,6,0);
    outObject->time = lVar2;
    dVar3 = flatbuffers::Table::GetField<double>(this,8,0.0);
    outObject->temperatureOutside = dVar3;
    dVar3 = flatbuffers::Table::GetField<double>(this,10,0.0);
    outObject->temperatureInside = dVar3;
    dVar3 = flatbuffers::Table::GetField<double>(this,0xc,0.0);
    outObject->temperatureCpu = dVar3;
    dVar3 = flatbuffers::Table::GetField<double>(this,0xe,0.0);
    outObject->loadCpu1 = dVar3;
    dVar3 = flatbuffers::Table::GetField<double>(this,0x10,0.0);
    outObject->loadCpu2 = dVar3;
    dVar3 = flatbuffers::Table::GetField<double>(this,0x12,0.0);
    outObject->loadCpu3 = dVar3;
    dVar3 = flatbuffers::Table::GetField<double>(this,0x14,0.0);
    outObject->loadCpu4 = dVar3;
    return;
  }
  __assert_fail("table",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/objectbox[P]objectbox-ts-demo/src/ts-data-model.obx.cpp"
                ,0x5c,
                "static void objectbox::tsdemo::SensorValues::_OBX_MetaInfo::fromFlatBuffer(const void *, size_t, objectbox::tsdemo::SensorValues &)"
               );
}

Assistant:

void objectbox::tsdemo::SensorValues::_OBX_MetaInfo::fromFlatBuffer(const void* data, size_t, objectbox::tsdemo::SensorValues& outObject) {
    const auto* table = flatbuffers::GetRoot<flatbuffers::Table>(data);
    assert(table);
    outObject.id = table->GetField<obx_id>(4, 0);
    outObject.time = table->GetField<int64_t>(6, 0);
    outObject.temperatureOutside = table->GetField<double>(8, 0.0);
    outObject.temperatureInside = table->GetField<double>(10, 0.0);
    outObject.temperatureCpu = table->GetField<double>(12, 0.0);
    outObject.loadCpu1 = table->GetField<double>(14, 0.0);
    outObject.loadCpu2 = table->GetField<double>(16, 0.0);
    outObject.loadCpu3 = table->GetField<double>(18, 0.0);
    outObject.loadCpu4 = table->GetField<double>(20, 0.0);
}